

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall libcellml::Model::clean(Model *this)

{
  string *__return_storage_ptr__;
  EntityImpl *pEVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  UnitsPtr u;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68 [3];
  string local_50;
  
  sVar3 = ComponentEntity::componentCount(&this->super_ComponentEntity);
  while (sVar3 = sVar3 - 1, sVar3 != 0xffffffffffffffff) {
    ComponentEntity::component((ComponentEntity *)(local_80 + 0x10),(size_t)this);
    bVar2 = traverseHierarchyAndRemoveIfEmpty((ComponentPtr *)(local_80 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_68);
    if (bVar2) {
      ComponentEntity::removeComponent(&this->super_ComponentEntity,sVar3);
    }
  }
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  sVar3 = (long)(pEVar1[4].mId.field_2._M_allocated_capacity - pEVar1[4].mId._M_string_length) >> 4;
  __return_storage_ptr__ = (string *)(local_80 + 0x10);
  do {
    sVar3 = sVar3 - 1;
    if (sVar3 == 0xffffffffffffffff) {
      return;
    }
    units((Model *)local_80,(size_t)this);
    bVar2 = ImportedEntity::isImport((ImportedEntity *)(local_80._0_8_ + 0x10));
    if (!bVar2) {
      NamedEntity::name_abi_cxx11_(__return_storage_ptr__,(NamedEntity *)local_80._0_8_);
      if (local_68[0]._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Entity::id_abi_cxx11_(&local_50,(Entity *)local_80._0_8_);
        if (local_50._M_string_length == 0) {
          sVar4 = Units::unitCount((Units *)local_80._0_8_);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          if (sVar4 == 0) {
            removeUnits(this,sVar3);
          }
          goto LAB_001f6bfe;
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
LAB_001f6bfe:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  } while( true );
}

Assistant:

void Model::clean()
{
    // Remove empty components.
    for (size_t i = componentCount() - 1; i != MAX_SIZE_T; --i) {
        if (traverseHierarchyAndRemoveIfEmpty(component(i))) {
            removeComponent(i);
        }
    }

    // Remove empty units.
    for (size_t i = unitsCount() - 1; i != MAX_SIZE_T; --i) {
        auto u = units(i);
        if (!u->isImport()
            && u->name().empty()
            && u->id().empty()
            && (u->unitCount() == 0)) {
            removeUnits(i);
        }
    }
}